

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function.cpp
# Opt level: O3

void __thiscall
duckdb::ScalarFunction::ScalarFunction
          (ScalarFunction *this,vector<duckdb::LogicalType,_true> *arguments,
          LogicalType *return_type,scalar_function_t *function,bind_scalar_function_t bind,
          bind_scalar_function_extended_t bind_extended,function_statistics_t statistics,
          init_local_state_t init_local_state,LogicalType varargs,FunctionStability side_effects,
          FunctionNullHandling null_handling,bind_lambda_function_t bind_lambda)

{
  _Manager_type p_Var1;
  LogicalType varargs_00;
  FunctionNullHandling null_handling_00;
  undefined8 bind_lambda_00;
  _Manager_type local_a8;
  vector<duckdb::LogicalType,_true> local_98;
  LogicalType local_80;
  string local_68;
  LogicalType local_48;
  
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_98.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_98.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_98.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  LogicalType::LogicalType(&local_80,return_type);
  local_a8 = (_Manager_type)0x0;
  bind_lambda_00 = (bind_lambda_function_t)0x0;
  p_Var1 = (function->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    bind_lambda_00 = *(undefined8 *)&(function->super__Function_base)._M_functor;
    (function->super__Function_base)._M_manager = (_Manager_type)0x0;
    function->_M_invoker = (_Invoker_type)0x0;
    local_a8 = p_Var1;
  }
  null_handling_00 = 0x71;
  LogicalType::LogicalType(&local_48,(LogicalType *)varargs._0_8_);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
       varargs.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  varargs_00._0_8_ = &local_48;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._1_7_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ =
       varargs.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_
  ;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._1_7_ = 0;
  ScalarFunction(this,&local_68,&local_98,&local_80,(scalar_function_t *)&stack0xffffffffffffff48,
                 bind,bind_extended,statistics,init_local_state,varargs_00,side_effects,
                 null_handling_00,(bind_lambda_function_t)bind_lambda_00);
  LogicalType::~LogicalType(&local_48);
  if (local_a8 != (_Manager_type)0x0) {
    (*local_a8)((_Any_data *)&stack0xffffffffffffff48,(_Any_data *)&stack0xffffffffffffff48,
                __destroy_functor);
  }
  LogicalType::~LogicalType(&local_80);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

ScalarFunction::ScalarFunction(vector<LogicalType> arguments, LogicalType return_type, scalar_function_t function,
                               bind_scalar_function_t bind, bind_scalar_function_extended_t bind_extended,
                               function_statistics_t statistics, init_local_state_t init_local_state,
                               LogicalType varargs, FunctionStability side_effects, FunctionNullHandling null_handling,
                               bind_lambda_function_t bind_lambda)
    : ScalarFunction(string(), std::move(arguments), std::move(return_type), std::move(function), bind, bind_extended,
                     statistics, init_local_state, std::move(varargs), side_effects, null_handling, bind_lambda) {
}